

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

int __thiscall
QMimeBinaryProvider::matchGlobList
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,int off,
          QString *fileName)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint theWeight;
  char cVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uchar *puVar11;
  storage_type *psVar12;
  uchar *puVar13;
  QString *pQVar14;
  QMimeProviderBase *pQVar15;
  QMimeProviderBase **ppQVar16;
  QMimeProviderBase **ppQVar17;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QMimeGlobPattern glob;
  int local_114;
  QString local_d8;
  QString local_b8;
  QString local_98;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar10 = (long)off;
  uVar7 = *(uint *)(cacheFile->data + lVar10);
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  if ((int)uVar7 < 1) {
    local_114 = 0;
  }
  else {
    ppQVar17 = &(this->super_QMimeProviderBase).m_overrideProvider;
    uVar9 = 0;
    local_114 = 0;
    do {
      puVar11 = cacheFile->data;
      uVar2 = *(uint *)(puVar11 + lVar10 + 4 + uVar9 * 0xc);
      uVar3 = *(uint *)(puVar11 + lVar10 + 8 + uVar9 * 0xc);
      uVar4 = *(uint *)(puVar11 + lVar10 + 0xc + uVar9 * 0xc);
      theWeight = uVar4 >> 0x18;
      ba.m_size = puVar11 + (int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                                 uVar2 << 0x18);
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar14 = (QString *)0xffffffffffffffff;
      do {
        puVar13 = ba.m_size + 1 + (long)pQVar14;
        pQVar14 = (QString *)((long)&(pQVar14->d).d + 1);
      } while (*puVar13 != '\0');
      ba.m_data = (storage_type *)puVar11;
      QString::fromLatin1((QString *)local_78,pQVar14,ba);
      local_b8.d.d = (Data *)local_78._0_8_;
      local_b8.d.ptr = (char16_t *)local_78._8_8_;
      local_b8.d.size = local_78._16_8_;
      puVar13 = cacheFile->data +
                (int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                     uVar3 << 0x18);
      if (cacheFile->data == (uchar *)0x0) {
        pQVar14 = (QString *)0x0;
      }
      else {
        pQVar14 = (QString *)0xffffffffffffffff;
        do {
          puVar1 = puVar13 + 1 + (long)pQVar14;
          pQVar14 = (QString *)((long)&(pQVar14->d).d + 1);
        } while (*puVar1 != '\0');
      }
      ba_00.m_data = (storage_type *)puVar11;
      ba_00.m_size = (qsizetype)puVar13;
      QString::fromLatin1((QString *)local_78,pQVar14,ba_00);
      local_98.d.d = (Data *)local_78._0_8_;
      local_98.d.ptr = (char16_t *)local_78._8_8_;
      local_98.d.size = local_78._16_8_;
      pQVar15 = *ppQVar17;
      ppQVar16 = ppQVar17;
      if (pQVar15 == (QMimeProviderBase *)0x0) {
        cVar5 = '\0';
      }
      else {
        do {
          iVar8 = (*pQVar15->_vptr_QMimeProviderBase[0xc])(pQVar15,&local_98);
          cVar5 = (char)iVar8;
          if (cVar5 != '\0') break;
          pQVar15 = (*ppQVar16)->m_overrideProvider;
          ppQVar16 = &(*ppQVar16)->m_overrideProvider;
        } while (pQVar15 != (QMimeProviderBase *)0x0);
      }
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar5 == '\0') {
        psVar12 = (storage_type *)(ulong)theWeight;
        local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
        QMimeGlobPattern::QMimeGlobPattern
                  ((QMimeGlobPattern *)local_78,&local_b8,&local_98,theWeight,
                   ((uVar4 & 0xff0000) >> 8 & 0x100) >> 8);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar6 = QMimeGlobPattern::matchFileName((QMimeGlobPattern *)local_78,fileName);
        if (bVar6) {
          ba_01.m_data = psVar12;
          ba_01.m_size = (qsizetype)puVar13;
          QString::fromLatin1(&local_98,pQVar14,ba_01);
          local_d8.d.d = local_98.d.d;
          local_d8.d.ptr = local_98.d.ptr;
          local_d8.d.size = local_98.d.size;
          QMimeGlobMatchResult::addMatch(result,&local_d8,theWeight,&local_b8,0);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_114 = local_114 + 1;
        }
        if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_114;
}

Assistant:

int QMimeBinaryProvider::matchGlobList(QMimeGlobMatchResult &result, CacheFile *cacheFile, int off,
                                       const QString &fileName)
{
    int numMatches = 0;
    const int numGlobs = cacheFile->getUint32(off);
    //qDebug() << "Loading" << numGlobs << "globs from" << cacheFile->file.fileName() << "at offset" << cacheFile->globListOffset;
    for (int i = 0; i < numGlobs; ++i) {
        const int globOffset = cacheFile->getUint32(off + 4 + 12 * i);
        const int mimeTypeOffset = cacheFile->getUint32(off + 4 + 12 * i + 4);
        const int flagsAndWeight = cacheFile->getUint32(off + 4 + 12 * i + 8);
        const int weight = flagsAndWeight & 0xff;
        const bool caseSensitive = flagsAndWeight & 0x100;
        const Qt::CaseSensitivity qtCaseSensitive = caseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
        const QString pattern = QLatin1StringView(cacheFile->getCharStar(globOffset));

        const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
        //qDebug() << pattern << mimeType << weight << caseSensitive;
        if (isMimeTypeGlobsExcluded(mimeType))
            continue;

        QMimeGlobPattern glob(pattern, QString() /*unused*/, weight, qtCaseSensitive);
        if (glob.matchFileName(fileName)) {
            result.addMatch(mimeType, weight, pattern);
            ++numMatches;
        }
    }
    return numMatches;
}